

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O3

void nn_node_dump(nn_trie_node *self,int indent)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  
  iVar6 = indent * 4;
  if (self == (nn_trie_node *)0x0) {
    pcVar4 = "NULL";
    if (indent != 0) {
      do {
        putchar(0x20);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
  }
  else {
    iVar3 = iVar6;
    if (indent == 0) {
      puts("===================");
      printf("refcount=%d\n",(ulong)self->refcount);
      printf("prefix_len=%d\n",(ulong)self->prefix_len);
    }
    else {
      do {
        putchar(0x20);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      puts("===================");
      iVar3 = iVar6;
      do {
        putchar(0x20);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      printf("refcount=%d\n",(ulong)self->refcount);
      iVar3 = iVar6;
      do {
        putchar(0x20);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      printf("prefix_len=%d\n",(ulong)self->prefix_len);
      iVar3 = iVar6;
      do {
        putchar(0x20);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    pcVar4 = "type=sparse";
    if (self->type == '\t') {
      pcVar4 = "type=dense";
    }
    puts(pcVar4);
    iVar3 = iVar6;
    if (indent != 0) {
      do {
        putchar(0x20);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    printf("prefix=\"");
    if (self->prefix_len != '\0') {
      uVar5 = 0;
      do {
        bVar1 = self->prefix[uVar5];
        if ((char)self->prefix[uVar5] < ' ') {
          bVar1 = 0x3f;
        }
        putchar((uint)bVar1);
        uVar5 = uVar5 + 1;
      } while (uVar5 != self->prefix_len);
    }
    puts("\"");
    if (self->type < 9) {
      iVar3 = iVar6;
      if (indent != 0) {
        do {
          putchar(0x20);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      printf("sparse.children=\"");
      if (self->type != '\0') {
        uVar5 = 0;
        do {
          bVar1 = self->prefix[uVar5 + 10];
          if ((char)self->prefix[uVar5 + 10] < ' ') {
            bVar1 = 0x3f;
          }
          putchar((uint)bVar1);
          uVar5 = uVar5 + 1;
        } while (uVar5 != self->type);
      }
      puts("\"");
      uVar2 = (uint)self->type;
    }
    else {
      iVar3 = iVar6;
      if (indent == 0) {
        bVar1 = (self->u).sparse.children[0];
        printf("dense.min=\'%c\' (%d)\n",(ulong)(uint)(int)(char)bVar1,(ulong)bVar1);
        bVar1 = (self->u).sparse.children[1];
        printf("dense.max=\'%c\' (%d)\n",(ulong)(uint)(int)(char)bVar1,(ulong)bVar1);
      }
      else {
        do {
          putchar(0x20);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
        bVar1 = (self->u).sparse.children[0];
        printf("dense.min=\'%c\' (%d)\n",(ulong)(uint)(int)(char)bVar1,(ulong)bVar1);
        iVar3 = iVar6;
        do {
          putchar(0x20);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
        bVar1 = (self->u).sparse.children[1];
        printf("dense.max=\'%c\' (%d)\n",(ulong)(uint)(int)(char)bVar1,(ulong)bVar1);
        iVar3 = iVar6;
        do {
          putchar(0x20);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      printf("dense.nbr=%d\n",(ulong)(self->u).dense.nbr);
      uVar2 = ((uint)(self->u).sparse.children[1] - (uint)(self->u).sparse.children[0]) + 1;
    }
    if (uVar2 != 0) {
      uVar5 = 0;
      do {
        nn_node_dump(*(nn_trie_node **)(self[1].prefix + uVar5 * 8 + -6),indent + 1);
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
    pcVar4 = "===================";
    if (indent != 0) {
      do {
        putchar(0x20);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
  }
  puts(pcVar4);
  return;
}

Assistant:

void nn_node_dump (struct nn_trie_node *self, int indent)
{
    int i;
    int children;

    if (!self) {
        nn_node_indent (indent);
        printf ("NULL\n");
        return;
    }

    nn_node_indent (indent);
    printf ("===================\n");
    nn_node_indent (indent);
    printf ("refcount=%d\n", (int) self->refcount);
    nn_node_indent (indent);
    printf ("prefix_len=%d\n", (int) self->prefix_len);
    nn_node_indent (indent);
    if (self->type == NN_TRIE_DENSE_TYPE)
        printf ("type=dense\n");
    else
        printf ("type=sparse\n");
    nn_node_indent (indent);
    printf ("prefix=\"");
    for (i = 0; i != self->prefix_len; ++i)
        nn_node_putchar (self->prefix [i]);
    printf ("\"\n");
    if (self->type <= 8) {
        nn_node_indent (indent);
        printf ("sparse.children=\"");
        for (i = 0; i != self->type; ++i)
            nn_node_putchar (self->u.sparse.children [i]);
        printf ("\"\n");
        children = self->type;
    }
    else {
        nn_node_indent (indent);
        printf ("dense.min='%c' (%d)\n", (char) self->u.dense.min,
            (int) self->u.dense.min);
        nn_node_indent (indent);
        printf ("dense.max='%c' (%d)\n", (char) self->u.dense.max,
            (int) self->u.dense.max);
        nn_node_indent (indent);
        printf ("dense.nbr=%d\n", (int) self->u.dense.nbr);
        children = self->u.dense.max - self->u.dense.min + 1;
    }

    for (i = 0; i != children; ++i)
        nn_node_dump (((struct nn_trie_node**) (self + 1)) [i], indent + 1);

    nn_node_indent (indent);
    printf ("===================\n");
}